

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O1

void * google::protobuf::internal::NewStringElement(Arena *arena)

{
  long *plVar1;
  
  if (arena == (Arena *)0x0) {
    plVar1 = (long *)operator_new(0x20);
  }
  else {
    plVar1 = (long *)ThreadSafeArena::AllocateFromStringBlock(&arena->impl_);
  }
  *plVar1 = (long)(plVar1 + 2);
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  return plVar1;
}

Assistant:

void* NewStringElement(Arena* arena) {
  return Arena::Create<std::string>(arena);
}